

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O2

void client_set_focused(natwm_state *state,client *client)

{
  theme *ptVar1;
  uint16_t previous_border_width;
  workspace *workspace;
  
  if ((client != (client *)0x0) && ((client->state & CLIENT_HIDDEN) == 0)) {
    workspace = workspace_list_find_client_workspace(state->workspace_list,client);
    if (workspace != (workspace *)0x0) {
      ptVar1 = state->workspace_list->theme;
      client->is_focused = true;
      client_set_window_input_focus(state,client->window);
      if (workspace->is_focused == false) {
        workspace_set_focused(state,workspace);
      }
      button_binding_ungrab(state,client->window,&client_focus_event);
      if ((client->state & CLIENT_UNTHEMED) == 0) {
        previous_border_width = ptVar1->border_width->unfocused;
      }
      else {
        previous_border_width = 0;
      }
      update_theme(state,client,previous_border_width);
      return;
    }
  }
  return;
}

Assistant:

void client_set_focused(struct natwm_state *state, struct client *client)
{
        if (client == NULL || client->state & CLIENT_HIDDEN) {
                return;
        }

        struct workspace *workspace
                = workspace_list_find_client_workspace(state->workspace_list, client);

        if (workspace == NULL) {
                return;
        }

        struct theme *theme = state->workspace_list->theme;

        client->is_focused = true;

        client_set_window_input_focus(state, client->window);

        if (!workspace->is_focused) {
                workspace_set_focused(state, workspace);
        }

        // Now that we have focused the client, there is no need for "click to
        // focus" so we can remove the button grab
        button_binding_ungrab(state, client->window, &client_focus_event);

        uint16_t previous_border_width = theme->border_width->unfocused;

        // If we have not added a border to this client before than the window
        // rect has not accounted for it
        if (client->state & CLIENT_UNTHEMED) {
                previous_border_width = 0;
        }

        update_theme(state, client, previous_border_width);
}